

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

ly_bool warn_is_specific_type(lysc_type *type,LY_DATA_TYPE base)

{
  ly_bool lVar1;
  ulong local_48;
  ulong local_38;
  uint64_t u;
  ly_bool ret;
  lysc_type_union *uni;
  LY_DATA_TYPE base_local;
  lysc_type *type_local;
  
  if (type->basetype == base) {
    type_local._7_1_ = '\x01';
  }
  else if (type->basetype == LY_TYPE_UNION) {
    local_38 = 0;
    while( true ) {
      if (type[1].name == (char *)0x0) {
        local_48 = 0;
      }
      else {
        local_48 = *(ulong *)(type[1].name + -8);
      }
      if (local_48 <= local_38) break;
      lVar1 = warn_is_specific_type(*(lysc_type **)(type[1].name + local_38 * 8),base);
      if (lVar1 != '\0') {
        return lVar1;
      }
      local_38 = local_38 + 1;
    }
    type_local._7_1_ = '\0';
  }
  else if (type->basetype == LY_TYPE_LEAFREF) {
    type_local._7_1_ = warn_is_specific_type((lysc_type *)type[1].plugin,base);
  }
  else {
    type_local._7_1_ = '\0';
  }
  return type_local._7_1_;
}

Assistant:

static ly_bool
warn_is_specific_type(struct lysc_type *type, LY_DATA_TYPE base)
{
    struct lysc_type_union *uni;
    ly_bool ret;
    LY_ARRAY_COUNT_TYPE u;

    if (type->basetype == base) {
        return 1;
    } else if (type->basetype == LY_TYPE_UNION) {
        uni = (struct lysc_type_union *)type;
        LY_ARRAY_FOR(uni->types, u) {
            ret = warn_is_specific_type(uni->types[u], base);
            if (ret) {
                /* found a suitable type */
                return ret;
            }
        }
        /* did not find any suitable type */
        return 0;
    } else if (type->basetype == LY_TYPE_LEAFREF) {
        return warn_is_specific_type(((struct lysc_type_leafref *)type)->realtype, base);
    }

    return 0;
}